

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

Binary * __thiscall i2p::sam::Session::MyDestination(Binary *__return_storage_ptr__,Session *this)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  ushort *puVar1;
  runtime_error *prVar2;
  unsigned_long *in_R8;
  unsigned_long *in_R9;
  long in_FS_OFFSET;
  unsigned_long local_58;
  size_t dest_len;
  uint16_t cert_len;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)((long)(this->m_private_key).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_private_key).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x183) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    dest_len = (long)(this->m_private_key).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_private_key).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_58 = 0x183;
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_40,(tinyformat *)"The private key is too short (%d < %d)",(char *)&dest_len,
               &local_58,in_R8);
    std::runtime_error::runtime_error(prVar2,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    puVar1 = (ushort *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->m_private_key,0x181);
    cert_len = *puVar1 << 8 | *puVar1 >> 8;
    dest_len = (ulong)cert_len + 0x183;
    __first._M_current =
         (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_private_key).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__first._M_current) < dest_len) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58 = (long)(this->m_private_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_private_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      tinyformat::format<unsigned_short,unsigned_long,unsigned_long>
                (&local_40,
                 (tinyformat *)
                 "Certificate length (%d) designates that the private key should be %d bytes, but it is only %d bytes"
                 ,(char *)&cert_len,(unsigned_short *)&dest_len,&local_58,in_R9);
      std::runtime_error::runtime_error(prVar2,(string *)&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 __first,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(__first._M_current + dest_len),(allocator_type *)&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Binary Session::MyDestination() const
{
    // From https://geti2p.net/spec/common-structures#destination:
    // "They are 387 bytes plus the certificate length specified at bytes 385-386, which may be
    // non-zero"
    static constexpr size_t DEST_LEN_BASE = 387;
    static constexpr size_t CERT_LEN_POS = 385;

    uint16_t cert_len;

    if (m_private_key.size() < CERT_LEN_POS + sizeof(cert_len)) {
        throw std::runtime_error(strprintf("The private key is too short (%d < %d)",
                                           m_private_key.size(),
                                           CERT_LEN_POS + sizeof(cert_len)));
    }

    memcpy(&cert_len, &m_private_key.at(CERT_LEN_POS), sizeof(cert_len));
    cert_len = be16toh_internal(cert_len);

    const size_t dest_len = DEST_LEN_BASE + cert_len;

    if (dest_len > m_private_key.size()) {
        throw std::runtime_error(strprintf("Certificate length (%d) designates that the private key should "
                                           "be %d bytes, but it is only %d bytes",
                                           cert_len,
                                           dest_len,
                                           m_private_key.size()));
    }

    return Binary{m_private_key.begin(), m_private_key.begin() + dest_len};
}